

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_smooth.c
# Opt level: O2

REF_STATUS ref_smooth_tri_uv_area_around(REF_GRID ref_grid,REF_INT node,REF_DBL *min_uv_area)

{
  REF_CELL ref_cell;
  REF_ADJ pRVar1;
  REF_ADJ_ITEM pRVar2;
  bool bVar3;
  uint uVar4;
  undefined8 uVar5;
  REF_INT cell;
  char *pcVar6;
  ulong uVar7;
  double dVar8;
  REF_DBL uv_area;
  ulong local_b8;
  REF_DBL sign_uv_area;
  REF_INT nodes [27];
  
  ref_cell = ref_grid->cell[3];
  *min_uv_area = -2.0;
  uVar7 = 0xffffffff;
  cell = -1;
  if (-1 < node) {
    pRVar1 = ref_cell->ref_adj;
    uVar7 = 0xffffffff;
    cell = -1;
    if (node < pRVar1->nnode) {
      uVar4 = pRVar1->first[(uint)node];
      uVar7 = 0xffffffff;
      cell = -1;
      if ((long)(int)uVar4 != -1) {
        cell = pRVar1->item[(int)uVar4].ref;
        uVar7 = (ulong)uVar4;
      }
    }
  }
  bVar3 = false;
  while( true ) {
    if ((int)uVar7 == -1) {
      if (!bVar3) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
               0xf2,"ref_smooth_tri_uv_area_around","no triangle found, can not compute min uv area"
              );
      }
      return (uint)!bVar3;
    }
    uVar4 = ref_cell_nodes(ref_cell,cell,nodes);
    if (uVar4 != 0) break;
    local_b8 = uVar7;
    uVar4 = ref_geom_uv_area_sign(ref_grid,nodes[ref_cell->node_per],&sign_uv_area);
    if (uVar4 != 0) {
      uVar7 = (ulong)uVar4;
      pcVar6 = "sign";
      uVar5 = 0xe7;
      goto LAB_001c1bb2;
    }
    uVar4 = ref_geom_uv_area(ref_grid->geom,nodes,&uv_area);
    if (uVar4 != 0) {
      uVar7 = (ulong)uVar4;
      pcVar6 = "uv area";
      uVar5 = 0xe8;
      goto LAB_001c1bb2;
    }
    uv_area = sign_uv_area * uv_area;
    dVar8 = uv_area;
    if ((bVar3) && (dVar8 = *min_uv_area, uv_area <= *min_uv_area)) {
      dVar8 = uv_area;
    }
    cell = -1;
    *min_uv_area = dVar8;
    pRVar2 = ref_cell->ref_adj->item;
    uVar7 = (ulong)pRVar2[(int)local_b8].next;
    bVar3 = true;
    if (uVar7 != 0xffffffffffffffff) {
      cell = pRVar2[uVar7].ref;
    }
  }
  uVar7 = (ulong)uVar4;
  pcVar6 = "nodes";
  uVar5 = 0xe5;
LAB_001c1bb2:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",uVar5,
         "ref_smooth_tri_uv_area_around",uVar7,pcVar6);
  return (REF_STATUS)uVar7;
}

Assistant:

REF_FCN static REF_STATUS ref_smooth_tri_uv_area_around(REF_GRID ref_grid,
                                                        REF_INT node,
                                                        REF_DBL *min_uv_area) {
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT id, item, cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_BOOL none_found = REF_TRUE;
  REF_DBL sign_uv_area, uv_area;

  *min_uv_area = -2.0;

  each_ref_cell_having_node(ref_cell, node, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");
    id = nodes[ref_cell_node_per(ref_cell)];
    RSS(ref_geom_uv_area_sign(ref_grid, id, &sign_uv_area), "sign");
    RSS(ref_geom_uv_area(ref_grid_geom(ref_grid), nodes, &uv_area), "uv area");
    uv_area *= sign_uv_area;
    if (none_found) {
      *min_uv_area = uv_area;
      none_found = REF_FALSE;
    } else {
      *min_uv_area = MIN(*min_uv_area, uv_area);
    }
  }

  if (none_found) THROW("no triangle found, can not compute min uv area");

  return REF_SUCCESS;
}